

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbols.cpp
# Opt level: O1

void ast::Symbols::print(ostream *os)

{
  long lVar1;
  uint uVar2;
  Symbol *symbol;
  long *plVar3;
  int iVar4;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ast::Symbol_*>
  pair_symbol;
  undefined1 *local_58 [2];
  undefined1 local_48 [16];
  long local_38;
  
  if (table_abi_cxx11_._16_8_ != 0) {
    plVar3 = (long *)table_abi_cxx11_._16_8_;
    do {
      local_58[0] = local_48;
      std::__cxx11::string::_M_construct<char*>((string *)local_58,plVar3[1],plVar3[2] + plVar3[1]);
      lVar1 = plVar3[5];
      iVar4 = 0;
      if (*(uint *)(lVar1 + 0x38) < 2) {
        iVar4 = *(int *)(*(long *)(lVar1 + 0x40) + 0x20);
      }
      local_38 = lVar1;
      uVar2 = Sections::get_address(*(uint *)(lVar1 + 0x3c));
      uVar2 = uVar2 + iVar4 & 0xffff;
      ostream_printf(os,"%-30s %-10s %5d %04x %d\n",*(undefined8 *)(lVar1 + 0x18),
                     *(undefined8 *)(value_type_name + (ulong)*(uint *)(lVar1 + 0x38) * 8),
                     (ulong)uVar2,(ulong)uVar2,*(undefined4 *)(lVar1 + 0x3c));
      if (local_58[0] != local_48) {
        operator_delete(local_58[0]);
      }
      plVar3 = (long *)*plVar3;
    } while (plVar3 != (long *)0x0);
  }
  return;
}

Assistant:

void Symbols::print(std::ostream &os)
{
	for (auto pair_symbol: table) {
		Symbol *symbol = pair_symbol.second;
		uint16_t value = symbol->get_value() + Sections::get_address(symbol->section);
		ostream_printf(os, "%-30s %-10s %5d %04x %d\n",
				symbol->name.c_str(), value_type_name[symbol->type],
				value, value, symbol->section);
	}
}